

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void AddAlign(TidyDocImpl *doc,Node *node,ctmbstr align)

{
  uint uVar1;
  tmbchar local_a8 [8];
  tmbchar buf [128];
  ctmbstr ptStack_20;
  uint i;
  ctmbstr align_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  prvTidytmbstrcpy(local_a8,"text-align: ");
  buf[0x7c] = '\f';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  ptStack_20 = align;
  for (; (uint)buf._124_4_ < 0x7f; buf._124_4_ = buf._124_4_ + 1) {
    uVar1 = prvTidyToLower((int)*ptStack_20);
    local_a8[(uint)buf._124_4_] = (char)uVar1;
    if ((char)uVar1 == '\0') break;
    ptStack_20 = ptStack_20 + 1;
  }
  local_a8[(uint)buf._124_4_] = '\0';
  prvTidyAddStyleProperty(doc,node,local_a8);
  return;
}

Assistant:

static void AddAlign( TidyDocImpl* doc, Node *node, ctmbstr align )
{
    uint i;
    tmbchar buf[128];

    TY_(tmbstrcpy)( buf, "text-align: " );
    for ( i = 12; i < sizeof(buf)/sizeof(buf[0])-1; ++i )
    {
        if ( (buf[i] = (tmbchar)TY_(ToLower)(*align++)) == '\0' )
            break;
    }
    buf[i] = '\0';
    TY_(AddStyleProperty)( doc, node, buf );
}